

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O2

void __thiscall
cornerstone::raft_server::handle_append_entries_resp(raft_server *this,resp_msg *resp)

{
  ulong uVar1;
  element_type *peVar2;
  ulong uVar3;
  ulong uVar4;
  long *plVar5;
  bool bVar6;
  int iVar7;
  iterator iVar8;
  undefined4 extraout_var;
  __node_base *p_Var9;
  char *__s;
  undefined4 extraout_var_00;
  long *plVar10;
  lock_guard<std::mutex> guard;
  mutex *__mutex;
  ptr<peer> p;
  shared_lock<std::shared_timed_mutex> rlock;
  vector<unsigned_long,_std::allocator<unsigned_long>_> matched_indexes;
  allocator_type local_c1;
  __shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2> local_c0 [2];
  shared_lock<std::shared_timed_mutex> local_a0;
  undefined1 local_90 [104];
  char *local_28;
  
  local_a0._M_pm = &this->peers_lock_;
  local_a0._M_owns = true;
  std::__shared_mutex_pthread::lock_shared(&(local_a0._M_pm)->super___shared_timed_mutex_base);
  local_90._0_4_ = (resp->super_msg_base).src_;
  iVar8 = std::
          _Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->peers_)._M_h,(key_type_conflict *)local_90);
  if (iVar8.
      super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>.
      _M_cur == (__node_type *)0x0) {
    peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_28 = "the response is from an unkonw peer %d";
    __s = strfmt<100>::fmt<int>((strfmt<100> *)local_90,(resp->super_msg_base).src_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c0,__s,(allocator<char> *)&local_c1);
    (*peVar2->_vptr_logger[3])(peVar2,local_c0);
    std::__cxx11::string::~string((string *)local_c0);
  }
  else {
    std::__shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (local_c0,(__shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2> *)
                        ((long)iVar8.
                               super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
                               ._M_cur + 0x10));
    __mutex = &(local_c0[0]._M_ptr)->lock_;
    if (resp->accepted_ == true) {
      std::mutex::lock(__mutex);
      uVar1 = resp->next_idx_;
      (local_c0[0]._M_ptr)->next_log_idx_ = uVar1;
      (local_c0[0]._M_ptr)->matched_idx_ = uVar1 - 1;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,
                 (this->peers_)._M_h._M_element_count + 1,&local_c1);
      iVar7 = (*((this->log_store_).
                 super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      plVar5 = (long *)CONCAT44(local_90._4_4_,local_90._0_4_);
      *plVar5 = CONCAT44(extraout_var,iVar7) + -1;
      p_Var9 = &(this->peers_)._M_h._M_before_begin;
      plVar10 = plVar5;
      while( true ) {
        plVar10 = plVar10 + 1;
        p_Var9 = p_Var9->_M_nxt;
        if (p_Var9 == (__node_base *)0x0) break;
        *plVar10 = (long)(*(_Hash_node_base **)
                           &((_Prime_rehash_policy *)(p_Var9 + 2))->_M_max_load_factor)[9]._M_nxt;
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<unsigned_long>>>
                (plVar5,local_90._8_8_);
      commit(this,*(ulong *)(CONCAT44(local_90._4_4_,local_90._0_4_) +
                            ((this->peers_)._M_h._M_element_count * 4 + 4 & 0xfffffffffffffff8)));
      bVar6 = peer::clear_pending_commit(local_c0[0]._M_ptr);
      if (bVar6) {
        bVar6 = false;
      }
      else {
        uVar4 = resp->next_idx_;
        iVar7 = (*((this->log_store_).
                   super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_log_store[2])();
        bVar6 = CONCAT44(extraout_var_00,iVar7) <= uVar4;
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_90);
    }
    else {
      std::mutex::lock(__mutex);
      uVar4 = resp->next_idx_;
      uVar3 = (local_c0[0]._M_ptr)->next_log_idx_;
      if (uVar4 < uVar3 && uVar4 != 0) {
        (local_c0[0]._M_ptr)->next_log_idx_ = uVar4;
      }
      else if (uVar3 != 0) {
        (local_c0[0]._M_ptr)->next_log_idx_ = uVar3 - 1;
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      bVar6 = false;
    }
    if ((!bVar6) && (this->role_ == leader)) {
      request_append_entries(this,local_c0[0]._M_ptr);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0[0]._M_refcount);
  }
  std::shared_lock<std::shared_timed_mutex>::~shared_lock(&local_a0);
  return;
}

Assistant:

void raft_server::handle_append_entries_resp(resp_msg& resp)
{
    read_lock(peers_lock_);
    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end())
    {
        l_->info(sstrfmt("the response is from an unkonw peer %d").fmt(resp.get_src()));
        return;
    }

    // if there are pending logs to be synced or commit index need to be advanced, continue to send appendEntries to
    // this peer
    bool need_to_catchup = true;
    ptr<peer> p = it->second;
    if (resp.get_accepted())
    {
        {
            auto_lock(p->get_lock());
            p->set_next_log_idx(resp.get_next_idx());
            p->set_matched_idx(resp.get_next_idx() - 1);
        }

        // try to commit with this response
        std::vector<ulong> matched_indexes(peers_.size() + 1);
        matched_indexes[0] = log_store_->next_slot() - 1;
        int i = 1;
        for (it = peers_.begin(); it != peers_.end(); ++it, i++)
        {
            matched_indexes[i] = it->second->get_matched_idx();
        }

        std::sort(matched_indexes.begin(), matched_indexes.end(), std::greater<ulong>());
        commit(matched_indexes[(peers_.size() + 1) / 2]);
        need_to_catchup = p->clear_pending_commit() || resp.get_next_idx() < log_store_->next_slot();
    }
    else
    {
        std::lock_guard<std::mutex> guard(p->get_lock());
        if (resp.get_next_idx() > 0 && p->get_next_log_idx() > resp.get_next_idx())
        {
            // fast move for the peer to catch up
            p->set_next_log_idx(resp.get_next_idx());
        }
        else if (p->get_next_log_idx() > 0)
        {
            p->set_next_log_idx(p->get_next_log_idx() - 1);
        }
    }

    // This may not be a leader anymore, such as the response was sent out long time ago
    // and the role was updated by UpdateTerm call
    // Try to match up the logs for this peer
    if (role_ == srv_role::leader && need_to_catchup)
    {
        request_append_entries(*p);
    }
}